

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_msl.cpp
# Opt level: O3

uint32_t __thiscall
spirv_cross::CompilerMSL::get_declared_struct_member_matrix_stride_msl
          (CompilerMSL *this,SPIRType *type,uint32_t index)

{
  bool bVar1;
  bool row_major;
  uint32_t uVar2;
  SPIRType *type_00;
  uint uVar3;
  
  type_00 = get_physical_member_type(this,type,index);
  bVar1 = CompilerGLSL::member_is_packed_physical_type(&this->super_CompilerGLSL,type,index);
  row_major = Compiler::has_member_decoration
                        ((Compiler *)this,(TypeID)(type->super_IVariant).self.id,index,
                         DecorationRowMajor);
  if (bVar1) {
    uVar3 = type_00->columns;
    if (type_00->columns < 2) {
      uVar3 = type_00->vecsize;
    }
    if (!row_major) {
      uVar3 = type_00->vecsize;
    }
    return uVar3 * (type_00->width >> 3);
  }
  uVar2 = get_declared_type_alignment_msl(this,type_00,false,row_major);
  return uVar2;
}

Assistant:

uint32_t CompilerMSL::get_declared_struct_member_matrix_stride_msl(const SPIRType &type, uint32_t index) const
{
	return get_declared_type_matrix_stride_msl(get_physical_member_type(type, index),
	                                           member_is_packed_physical_type(type, index),
	                                           has_member_decoration(type.self, index, DecorationRowMajor));
}